

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptional.cxx
# Opt level: O2

void __thiscall EventLogger::~EventLogger(EventLogger *this)

{
  Event local_20;
  
  local_20.Type = DESTRUCT;
  local_20.Logger2 = (EventLogger *)0x0;
  local_20.Value = this->Value;
  local_20.Logger1 = this;
  std::vector<Event,_std::allocator<Event>_>::emplace_back<Event>(&events,&local_20);
  return;
}

Assistant:

EventLogger::~EventLogger()
{
  BEGIN_IGNORE_UNINITIALIZED
  events.push_back({ Event::DESTRUCT, this, nullptr, this->Value });
  END_IGNORE_UNINITIALIZED
}